

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void receive_field_slice(int left,int width,int source_rank)

{
  int iVar1;
  celle ***pppcVar2;
  cellb ***pppcVar3;
  cellj ***pppcVar4;
  cellbe ***pppcVar5;
  undefined4 in_EDX;
  int in_ESI;
  int size;
  int tag;
  undefined8 in_stack_ffffffffffffffd8;
  int iVar6;
  field3d<cellb> *in_stack_ffffffffffffffe0;
  
  iVar6 = (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  iVar1 = in_ESI * 3 * ny_global * nz_global;
  std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
            ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)0x146dbb);
  pppcVar2 = field3d<celle>::operator[]((field3d<celle> *)in_stack_ffffffffffffffe0,iVar6);
  iVar6 = 0;
  MPI_Recv(**pppcVar2,iVar1,&ompi_mpi_double,in_EDX,0,&ompi_mpi_comm_world);
  std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
            ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)0x146e14);
  pppcVar3 = field3d<cellb>::operator[](in_stack_ffffffffffffffe0,iVar6);
  iVar6 = 0;
  MPI_Recv(**pppcVar3,iVar1,&ompi_mpi_double,in_EDX,1,&ompi_mpi_comm_world);
  std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
            ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)0x146e6d);
  pppcVar4 = field3d<cellj>::operator[]((field3d<cellj> *)in_stack_ffffffffffffffe0,iVar6);
  iVar6 = 0;
  MPI_Recv(**pppcVar4,iVar1,&ompi_mpi_double,in_EDX,2,&ompi_mpi_comm_world);
  std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
            ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)0x146ec6);
  pppcVar5 = field3d<cellbe>::operator[]((field3d<cellbe> *)in_stack_ffffffffffffffe0,iVar6);
  MPI_Recv(**pppcVar5,iVar1,&ompi_mpi_double,in_EDX,3,&ompi_mpi_comm_world,0);
  return;
}

Assistant:

void receive_field_slice(int left, int width, int source_rank) {
    int tag = 0;

    const int size = 3 * width * ny_global * nz_global;
    MPI_Recv(psr->ce[left][0], size, MPI_DOUBLE, source_rank, tag++, MPI_COMM_WORLD, MPI_STATUS_IGNORE);
    MPI_Recv(psr->cb[left][0], size, MPI_DOUBLE, source_rank, tag++, MPI_COMM_WORLD, MPI_STATUS_IGNORE);
    MPI_Recv(psr->cj[left][0], size, MPI_DOUBLE, source_rank, tag++, MPI_COMM_WORLD, MPI_STATUS_IGNORE);
    MPI_Recv(psr->cbe[left][0], size, MPI_DOUBLE, source_rank, tag++, MPI_COMM_WORLD, MPI_STATUS_IGNORE);
}